

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O1

Variant * Jinx::Impl::ParseValue(Variant *__return_storage_ptr__,String *value,NumericFormat format)

{
  bool bVar1;
  longlong value_00;
  bool boolean;
  double number;
  Guid guid;
  bool local_39;
  pointer local_38;
  Guid local_30;
  
  bVar1 = StringToGuid(value,&local_30);
  if (bVar1) {
    __return_storage_ptr__->m_type = Null;
    Variant::SetGuid(__return_storage_ptr__,&local_30);
  }
  else {
    value_00 = strtoll((value->_M_dataplus)._M_p,&local_38,10);
    if (local_38 == (value->_M_dataplus)._M_p + value->_M_string_length) {
      __return_storage_ptr__->m_type = Null;
      Variant::SetInteger(__return_storage_ptr__,value_00);
    }
    else {
      bVar1 = StringToNumber(value,(double *)&local_38,format);
      if (bVar1) {
        __return_storage_ptr__->m_type = Null;
        Variant::SetNumber(__return_storage_ptr__,(double)local_38);
      }
      else {
        bVar1 = StringToBoolean(value,&local_39);
        if (bVar1) {
          __return_storage_ptr__->m_type = Null;
          Variant::SetBoolean(__return_storage_ptr__,local_39);
        }
        else {
          __return_storage_ptr__->m_type = Null;
          Variant::SetString(__return_storage_ptr__,value);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant ParseValue(const String & value, NumericFormat format)
	{
		Guid guid;
		if (StringToGuid(value, &guid))
			return guid;
		int64_t integer;
		if (StringToInteger(value, &integer))
			return integer;
		double number;
		if (StringToNumber(value, &number, format))
			return number;
		bool boolean;
		if (StringToBoolean(value, &boolean))
			return boolean;
		return value;
	}